

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O1

string * __thiscall
duckdb::MinimumUniqueAlias_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,BindingAlias *alias,BindingAlias *other)

{
  pointer pcVar1;
  long lVar2;
  bool bVar3;
  string *psVar4;
  string *l2;
  long *plVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  psVar4 = BindingAlias::GetAlias_abi_cxx11_((BindingAlias *)this);
  l2 = BindingAlias::GetAlias_abi_cxx11_(alias);
  bVar3 = StringUtil::CIEquals(psVar4,l2);
  if (bVar3) {
    bVar3 = StringUtil::CIEquals((string *)(this + 0x20),&alias->schema);
    if (bVar3) {
      BindingAlias::ToString_abi_cxx11_(__return_storage_ptr__,(BindingAlias *)this);
    }
    else {
      local_40[0] = local_30;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_40,*(long *)(this + 0x20),
                 *(long *)(this + 0x28) + *(long *)(this + 0x20));
      ::std::__cxx11::string::append((char *)local_40);
      psVar4 = BindingAlias::GetAlias_abi_cxx11_((BindingAlias *)this);
      plVar5 = (long *)::std::__cxx11::string::_M_append
                                 ((char *)local_40,(ulong)(psVar4->_M_dataplus)._M_p);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar6) {
        lVar2 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_40[0] != local_30) {
        operator_delete(local_40[0]);
      }
    }
  }
  else {
    psVar4 = BindingAlias::GetAlias_abi_cxx11_((BindingAlias *)this);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (psVar4->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar4->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

string MinimumUniqueAlias(const BindingAlias &alias, const BindingAlias &other) {
	if (!StringUtil::CIEquals(alias.GetAlias(), other.GetAlias())) {
		return alias.GetAlias();
	}
	if (!StringUtil::CIEquals(alias.GetSchema(), other.GetSchema())) {
		return alias.GetSchema() + "." + alias.GetAlias();
	}
	return alias.ToString();
}